

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_sx_sy_w16n_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined1 auVar1 [16];
  unkbyte9 Var2;
  undefined1 auVar3 [16];
  ulong in_RSI;
  ulong uVar4;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  ulong uVar5;
  uint8_t *src0_00;
  __m128i *v_m0_b_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  ulong uVar6;
  uint8_t *src1_00;
  __m128i alVar7;
  __m128i v_val_w;
  __m128i v_val_w_00;
  long in_stack_00000008;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  __m128i v_m0h_w;
  __m128i v_m0l_w;
  __m128i v_rsh_w;
  __m128i v_rsl_w;
  __m128i v_rvsbh_w;
  __m128i v_rvsbl_w;
  __m128i v_rvsah_w;
  __m128i v_rvsal_w;
  __m128i v_rvsh_b;
  __m128i v_rvsl_b;
  __m128i v_rbh_b;
  __m128i v_rbl_b;
  __m128i v_rah_b;
  __m128i v_ral_b;
  int c;
  __m128i _r;
  __m128i v_maxval_b;
  __m128i v_zmask_b;
  undefined4 local_21c;
  undefined8 local_1d8;
  undefined8 local_1b8;
  undefined1 uStack_127;
  undefined1 uStack_125;
  undefined1 uStack_123;
  undefined1 uStack_121;
  undefined1 uStack_120;
  undefined1 uStack_11f;
  undefined1 uStack_11e;
  undefined1 uStack_11d;
  undefined1 uStack_11c;
  undefined1 uStack_11b;
  undefined1 uStack_11a;
  undefined1 uStack_119;
  undefined1 uStack_117;
  undefined1 uStack_115;
  undefined1 uStack_113;
  undefined1 uStack_111;
  undefined1 uStack_110;
  undefined1 uStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  undefined1 uStack_10c;
  undefined1 uStack_10b;
  undefined1 uStack_10a;
  undefined1 uStack_109;
  undefined1 local_108;
  undefined1 uStack_107;
  undefined1 uStack_106;
  undefined1 uStack_105;
  undefined1 uStack_104;
  undefined1 uStack_103;
  undefined1 uStack_102;
  undefined1 uStack_101;
  undefined1 uStack_100;
  undefined1 uStack_ff;
  undefined1 uStack_fe;
  undefined1 uStack_fd;
  undefined1 uStack_fc;
  undefined1 uStack_fb;
  undefined1 uStack_fa;
  undefined1 uStack_f9;
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined1 uStack_ee;
  undefined1 uStack_ed;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  undefined2 local_38;
  undefined2 uStack_36;
  undefined2 uStack_34;
  undefined2 uStack_32;
  undefined2 uStack_30;
  undefined2 uStack_2e;
  undefined2 uStack_2c;
  undefined2 uStack_2a;
  
  uVar4 = in_RSI;
  local_1d8 = in_R8;
  local_1b8 = in_RDI;
  do {
    for (local_21c = 0; local_21c < (int)v_res_b[1]; local_21c = local_21c + 0x10) {
      xx_loadu_128((void *)(in_stack_00000008 + local_21c * 2));
      xx_loadu_128((void *)(in_stack_00000008 + 0x10 + (long)(local_21c * 2)));
      xx_loadu_128((void *)(in_stack_00000008 + (ulong)(uint)v_res_b[0] + (long)(local_21c * 2)));
      alVar7 = xx_loadu_128((void *)((long)(local_21c * 2) + 0x10 +
                                    in_stack_00000008 + (ulong)(uint)v_res_b[0]));
      local_f8 = (char)extraout_XMM0_Qa;
      uStack_f7 = (char)((ulong)extraout_XMM0_Qa >> 8);
      uStack_f6 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
      uStack_f5 = (char)((ulong)extraout_XMM0_Qa >> 0x18);
      uStack_f4 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
      uStack_f3 = (char)((ulong)extraout_XMM0_Qa >> 0x28);
      uStack_f2 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
      uStack_f1 = (char)((ulong)extraout_XMM0_Qa >> 0x38);
      uStack_f0 = (char)extraout_XMM0_Qb;
      uStack_ef = (char)((ulong)extraout_XMM0_Qb >> 8);
      uStack_ee = (char)((ulong)extraout_XMM0_Qb >> 0x10);
      uStack_ed = (char)((ulong)extraout_XMM0_Qb >> 0x18);
      uStack_ec = (char)((ulong)extraout_XMM0_Qb >> 0x20);
      uStack_eb = (char)((ulong)extraout_XMM0_Qb >> 0x28);
      uStack_ea = (char)((ulong)extraout_XMM0_Qb >> 0x30);
      uStack_e9 = (char)((ulong)extraout_XMM0_Qb >> 0x38);
      local_108 = (char)extraout_XMM0_Qa_01;
      uStack_107 = (char)((ulong)extraout_XMM0_Qa_01 >> 8);
      uStack_106 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x10);
      uStack_105 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x18);
      uStack_104 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x20);
      uStack_103 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x28);
      uStack_102 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x30);
      uStack_101 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x38);
      uStack_100 = (char)extraout_XMM0_Qb_01;
      uStack_ff = (char)((ulong)extraout_XMM0_Qb_01 >> 8);
      uStack_fe = (char)((ulong)extraout_XMM0_Qb_01 >> 0x10);
      uStack_fd = (char)((ulong)extraout_XMM0_Qb_01 >> 0x18);
      uStack_fc = (char)((ulong)extraout_XMM0_Qb_01 >> 0x20);
      uStack_fb = (char)((ulong)extraout_XMM0_Qb_01 >> 0x28);
      uStack_fa = (char)((ulong)extraout_XMM0_Qb_01 >> 0x30);
      uStack_f9 = (char)((ulong)extraout_XMM0_Qb_01 >> 0x38);
      uStack_117 = (char)((ulong)extraout_XMM0_Qa_00 >> 8);
      uStack_115 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x18);
      uStack_113 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x28);
      uStack_111 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x38);
      uStack_110 = (char)extraout_XMM0_Qb_00;
      uStack_10f = (char)((ulong)extraout_XMM0_Qb_00 >> 8);
      uStack_10e = (char)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      uStack_10d = (char)((ulong)extraout_XMM0_Qb_00 >> 0x18);
      uStack_10c = (char)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      uStack_10b = (char)((ulong)extraout_XMM0_Qb_00 >> 0x28);
      uStack_10a = (char)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      uStack_109 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x38);
      uStack_127 = (char)((ulong)extraout_XMM0_Qa_02 >> 8);
      uStack_125 = (char)((ulong)extraout_XMM0_Qa_02 >> 0x18);
      uStack_123 = (char)((ulong)extraout_XMM0_Qa_02 >> 0x28);
      uStack_121 = (char)((ulong)extraout_XMM0_Qa_02 >> 0x38);
      uStack_120 = (char)extraout_XMM0_Qb_02;
      uStack_11f = (char)((ulong)extraout_XMM0_Qb_02 >> 8);
      uStack_11e = (char)((ulong)extraout_XMM0_Qb_02 >> 0x10);
      uStack_11d = (char)((ulong)extraout_XMM0_Qb_02 >> 0x18);
      uStack_11c = (char)((ulong)extraout_XMM0_Qb_02 >> 0x20);
      uStack_11b = (char)((ulong)extraout_XMM0_Qb_02 >> 0x28);
      uStack_11a = (char)((ulong)extraout_XMM0_Qb_02 >> 0x30);
      uStack_119 = (char)((ulong)extraout_XMM0_Qb_02 >> 0x38);
      uVar5 = (ulong)CONCAT16(uStack_f2 + uStack_102,
                              CONCAT15(uStack_f3 + uStack_103,
                                       CONCAT14(uStack_f4 + uStack_104,
                                                CONCAT13(uStack_f5 + uStack_105,
                                                         CONCAT12(uStack_f6 + uStack_106,
                                                                  CONCAT11(uStack_f7 + uStack_107,
                                                                           local_f8 + local_108)))))
                             ) & 0xff00ff00ff00ff;
      uVar6 = (ulong)CONCAT16(uStack_ea + uStack_fa,
                              CONCAT15(uStack_eb + uStack_fb,
                                       CONCAT14(uStack_ec + uStack_fc,
                                                CONCAT13(uStack_ed + uStack_fd,
                                                         CONCAT12(uStack_ee + uStack_fe,
                                                                  CONCAT11(uStack_ef + uStack_ff,
                                                                           uStack_f0 + uStack_100)))
                                               ))) & 0xff00ff00ff00ff;
      Var2 = CONCAT18(uStack_f0 + uStack_100,
                      CONCAT17(uStack_f1 + uStack_101,
                               CONCAT16(uStack_f2 + uStack_102,
                                        CONCAT15(uStack_f3 + uStack_103,
                                                 CONCAT14(uStack_f4 + uStack_104,
                                                          CONCAT13(uStack_f5 + uStack_105,
                                                                   CONCAT12(uStack_f6 + uStack_106,
                                                                            CONCAT11(uStack_f7 +
                                                                                     uStack_107,
                                                                                     local_f8 +
                                                                                     local_108))))))
                              ));
      auVar3[9] = uStack_ef + uStack_ff;
      auVar3._0_9_ = Var2;
      auVar3[10] = uStack_ee + uStack_fe;
      auVar3[0xb] = uStack_ed + uStack_fd;
      auVar3[0xc] = uStack_ec + uStack_fc;
      auVar3[0xd] = uStack_eb + uStack_fb;
      auVar3[0xe] = uStack_ea + uStack_fa;
      auVar3[0xf] = uStack_e9 + uStack_f9;
      local_b8 = (ulong)((unkuint9)Var2 >> 8);
      uStack_b0 = auVar3._8_8_ >> 8;
      src0_00 = (uint8_t *)(local_b8 & 0xff00ff00ff00ff);
      uStack_b0 = uStack_b0 & 0xff00ff00ff00ff;
      Var2 = CONCAT18(uStack_110 + uStack_120,
                      CONCAT17(uStack_111 + uStack_121,
                               (uint7)CONCAT15(uStack_113 + uStack_123,
                                               (uint5)CONCAT13(uStack_115 + uStack_125,
                                                               (uint3)(byte)(uStack_117 + uStack_127
                                                                            ) << 8))));
      auVar1[9] = uStack_10f + uStack_11f;
      auVar1._0_9_ = Var2;
      auVar1[10] = uStack_10e + uStack_11e;
      auVar1[0xb] = uStack_10d + uStack_11d;
      auVar1[0xc] = uStack_10c + uStack_11c;
      auVar1[0xd] = uStack_10b + uStack_11b;
      auVar1[0xe] = uStack_10a + uStack_11a;
      auVar1[0xf] = uStack_109 + uStack_119;
      local_d8 = (ulong)((unkuint9)Var2 >> 8);
      uStack_d0 = auVar1._8_8_ >> 8;
      v_m0_b_00 = (__m128i *)(local_d8 & 0xff00ff00ff00ff);
      src1_00 = (uint8_t *)(uStack_d0 & 0xff00ff00ff00ff);
      local_38 = (short)uVar5;
      uStack_36 = (short)(uVar5 >> 0x10);
      uStack_34 = (short)(uVar5 >> 0x20);
      uStack_32 = (short)(uVar5 >> 0x30);
      uStack_30 = (short)uVar6;
      uStack_2e = (short)(uVar6 >> 0x10);
      uStack_2c = (short)(uVar6 >> 0x20);
      uStack_2a = (short)(uVar6 >> 0x30);
      local_48 = (short)src0_00;
      uStack_46 = (short)((ulong)src0_00 >> 0x10);
      uStack_44 = (short)((ulong)src0_00 >> 0x20);
      uStack_42 = (short)((ulong)src0_00 >> 0x30);
      uStack_40 = (short)uStack_b0;
      uStack_3e = (short)(uStack_b0 >> 0x10);
      uStack_3c = (short)(uStack_b0 >> 0x20);
      uStack_3a = (short)(uStack_b0 >> 0x30);
      local_38 = local_38 + local_48;
      uStack_36 = uStack_36 + uStack_46;
      uStack_34 = uStack_34 + uStack_44;
      uStack_32 = uStack_32 + uStack_42;
      uStack_30 = uStack_30 + uStack_40;
      uStack_2e = uStack_2e + uStack_3e;
      uStack_2c = uStack_2c + uStack_3c;
      uStack_2a = uStack_2a + uStack_3a;
      v_val_w[1] = uVar4;
      v_val_w[0] = 2;
      alVar7 = xx_roundn_epu16(v_val_w,(int)alVar7[1]);
      v_val_w_00[1] = uVar4;
      v_val_w_00[0] = 2;
      xx_roundn_epu16(v_val_w_00,(int)alVar7[1]);
      uVar4 = local_1d8 + local_21c;
      alVar7 = blend_16_u8(src0_00,src1_00,v_m0_b_00,
                           (__m128i *)
                           CONCAT26(uStack_2a,CONCAT24(uStack_2c,CONCAT22(uStack_2e,uStack_30))),
                           (__m128i *)
                           CONCAT26(uStack_32,CONCAT24(uStack_34,CONCAT22(uStack_36,local_38))));
      alVar7[0] = uVar4;
      xx_storeu_128((void *)(local_1b8 + local_21c),alVar7);
    }
    local_1b8 = local_1b8 + (in_RSI & 0xffffffff);
    local_1d8 = local_1d8 + (ulong)in_R9D;
    in_stack_00000008 = in_stack_00000008 + (ulong)((uint)v_res_b[0] << 1);
    v_m1_b[0]._0_4_ = (int)v_m1_b[0] + -1;
  } while ((int)v_m1_b[0] != 0);
  return;
}

Assistant:

static void blend_a64_mask_sx_sy_w16n_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_zmask_b =
      _mm_set_epi8(0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  do {
    int c;
    for (c = 0; c < w; c += 16) {
      const __m128i v_ral_b = xx_loadu_128(mask + 2 * c);
      const __m128i v_rah_b = xx_loadu_128(mask + 2 * c + 16);
      const __m128i v_rbl_b = xx_loadu_128(mask + mask_stride + 2 * c);
      const __m128i v_rbh_b = xx_loadu_128(mask + mask_stride + 2 * c + 16);
      const __m128i v_rvsl_b = _mm_add_epi8(v_ral_b, v_rbl_b);
      const __m128i v_rvsh_b = _mm_add_epi8(v_rah_b, v_rbh_b);
      const __m128i v_rvsal_w = _mm_and_si128(v_rvsl_b, v_zmask_b);
      const __m128i v_rvsah_w = _mm_and_si128(v_rvsh_b, v_zmask_b);
      const __m128i v_rvsbl_w =
          _mm_and_si128(_mm_srli_si128(v_rvsl_b, 1), v_zmask_b);
      const __m128i v_rvsbh_w =
          _mm_and_si128(_mm_srli_si128(v_rvsh_b, 1), v_zmask_b);
      const __m128i v_rsl_w = _mm_add_epi16(v_rvsal_w, v_rvsbl_w);
      const __m128i v_rsh_w = _mm_add_epi16(v_rvsah_w, v_rvsbh_w);

      const __m128i v_m0l_w = xx_roundn_epu16(v_rsl_w, 2);
      const __m128i v_m0h_w = xx_roundn_epu16(v_rsh_w, 2);
      const __m128i v_m0_b = _mm_packus_epi16(v_m0l_w, v_m0h_w);
      const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

      const __m128i v_res_b =
          blend_16_u8(src0 + c, src1 + c, &v_m0_b, &v_m1_b, &_r);

      xx_storeu_128(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}